

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fp-impl.inc.c
# Opt level: O0

void gen_fcmpu(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx_00;
  uint32_t uVar1;
  TCGv_i64 dst;
  TCGv_i64 dst_00;
  TCGv_i32 arg4;
  TCGv_i64 t1;
  TCGv_i64 t0;
  TCGv_i32 crf;
  TCGContext_conflict10 *tcg_ctx;
  DisasContext_conflict10 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  if (((ctx->fpu_enabled ^ 0xffU) & 1) == 0) {
    dst = tcg_temp_new_i64(tcg_ctx_00);
    dst_00 = tcg_temp_new_i64(tcg_ctx_00);
    gen_reset_fpstatus(tcg_ctx_00);
    uVar1 = crfD(ctx->opcode);
    arg4 = tcg_const_i32_ppc64(tcg_ctx_00,uVar1);
    uVar1 = rA(ctx->opcode);
    get_fpr(tcg_ctx_00,dst,uVar1);
    uVar1 = rB(ctx->opcode);
    get_fpr(tcg_ctx_00,dst_00,uVar1);
    gen_helper_fcmpu(tcg_ctx_00,tcg_ctx_00->cpu_env,dst,dst_00,arg4);
    tcg_temp_free_i32(tcg_ctx_00,arg4);
    gen_helper_float_check_status(tcg_ctx_00,tcg_ctx_00->cpu_env);
    tcg_temp_free_i64(tcg_ctx_00,dst);
    tcg_temp_free_i64(tcg_ctx_00,dst_00);
  }
  else {
    gen_exception(ctx,7);
  }
  return;
}

Assistant:

static void gen_fcmpu(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;                                   \
    TCGv_i32 crf;
    TCGv_i64 t0;
    TCGv_i64 t1;
    if (unlikely(!ctx->fpu_enabled)) {
        gen_exception(ctx, POWERPC_EXCP_FPU);
        return;
    }
    t0 = tcg_temp_new_i64(tcg_ctx);
    t1 = tcg_temp_new_i64(tcg_ctx);
    gen_reset_fpstatus(tcg_ctx);
    crf = tcg_const_i32(tcg_ctx, crfD(ctx->opcode));
    get_fpr(tcg_ctx, t0, rA(ctx->opcode));
    get_fpr(tcg_ctx, t1, rB(ctx->opcode));
    gen_helper_fcmpu(tcg_ctx, tcg_ctx->cpu_env, t0, t1, crf);
    tcg_temp_free_i32(tcg_ctx, crf);
    gen_helper_float_check_status(tcg_ctx, tcg_ctx->cpu_env);
    tcg_temp_free_i64(tcg_ctx, t0);
    tcg_temp_free_i64(tcg_ctx, t1);
}